

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O3

void __thiscall
bssl::anon_unknown_0::QUICMethodTest_BadPostHandshake_Test::TestBody
          (QUICMethodTest_BadPostHandshake_Test *this)

{
  bool bVar1;
  internal iVar2;
  int iVar3;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var4;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  char *pcVar5;
  char *in_R9;
  uint8_t kJunk [8];
  SSL_QUIC_METHOD quic_method;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_80;
  AssertHelper local_78;
  Message local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_68;
  undefined1 local_60 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  AssertHelper local_40;
  SSL_QUIC_METHOD local_38;
  
  local_38.set_read_secret = QUICMethodTest::SetReadSecretCallback;
  local_38.set_write_secret = QUICMethodTest::SetWriteSecretCallback;
  local_38.add_handshake_data = QUICMethodTest::AddHandshakeDataCallback;
  local_38.flush_flight = QUICMethodTest::FlushFlightCallback;
  local_38.send_alert = QUICMethodTest::SendAlertCallback;
  std::__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>::reset
            ((__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter> *)
             &(anonymous_namespace)::g_last_session,(pointer)0x0);
  SSL_CTX_set_session_cache_mode
            ((this->super_QUICMethodTest).client_ctx_._M_t.
             super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
             super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,3);
  SSL_CTX_sess_set_new_cb
            ((SSL_CTX *)
             (this->super_QUICMethodTest).client_ctx_._M_t.
             super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
             super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,SaveLastSession);
  iVar3 = SSL_CTX_set_quic_method
                    ((this->super_QUICMethodTest).client_ctx_._M_t.
                     super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                     super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,&local_38);
  local_70.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ =
       CONCAT31(local_70.ss_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._1_3_,iVar3 != 0);
  local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (iVar3 == 0) {
    testing::Message::Message((Message *)&local_80);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_60,(internal *)&local_70,
               (AssertionResult *)"SSL_CTX_set_quic_method(client_ctx_.get(), &quic_method)","false"
               ,"true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x1f0d,(char *)CONCAT71(local_60._1_7_,local_60[0]));
    testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_80);
LAB_001c21cc:
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    _Var4._M_head_impl = local_80._M_head_impl;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_60._1_7_,local_60[0]) != &local_50) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_60._1_7_,local_60[0]),local_50._M_allocated_capacity + 1);
      _Var4._M_head_impl = local_80._M_head_impl;
    }
  }
  else {
    iVar3 = SSL_CTX_set_quic_method
                      ((this->super_QUICMethodTest).server_ctx_._M_t.
                       super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                       super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,&local_38);
    local_70.ss_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_4_ =
         CONCAT31(local_70.ss_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl._1_3_,iVar3 != 0);
    local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar3 == 0) {
      testing::Message::Message((Message *)&local_80);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_60,(internal *)&local_70,
                 (AssertionResult *)"SSL_CTX_set_quic_method(server_ctx_.get(), &quic_method)",
                 "false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_78,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x1f0e,(char *)CONCAT71(local_60._1_7_,local_60[0]));
      testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_80);
      goto LAB_001c21cc;
    }
    bVar1 = QUICMethodTest::CreateClientAndServer(&this->super_QUICMethodTest);
    local_70.ss_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_4_ =
         CONCAT31(local_70.ss_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl._1_3_,bVar1);
    local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (!bVar1) {
      testing::Message::Message((Message *)&local_80);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_60,(internal *)&local_70,
                 (AssertionResult *)"CreateClientAndServer()","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_78,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x1f0f,(char *)CONCAT71(local_60._1_7_,local_60[0]));
      testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_80);
      goto LAB_001c21cc;
    }
    bVar1 = QUICMethodTest::RunQUICHandshakesAndExpectError(&this->super_QUICMethodTest,kNoError);
    local_70.ss_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_4_ =
         CONCAT31(local_70.ss_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl._1_3_,bVar1);
    local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (!bVar1) {
      testing::Message::Message((Message *)&local_80);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_60,(internal *)&local_70,
                 (AssertionResult *)"CompleteHandshakesForQUIC()","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_78,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x1f10,(char *)CONCAT71(local_60._1_7_,local_60[0]));
      testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_80);
      goto LAB_001c21cc;
    }
    local_70.ss_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_4_ =
         SSL_do_handshake((SSL *)(this->super_QUICMethodTest).client_._M_t.
                                 super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                                 super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                                 super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
    local_80._M_head_impl._0_4_ = 1;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_60,"SSL_do_handshake(client_.get())","1",(int *)&local_70,
               (int *)&local_80);
    if (local_60[0] == (internal)0x0) {
      testing::Message::Message(&local_70);
      if (local_58 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar5 = "";
      }
      else {
        pcVar5 = (local_58->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_80,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x1f12,pcVar5);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_80,&local_70);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_80);
      if ((long *)CONCAT44(local_70.ss_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl._4_4_,
                           (int)local_70.ss_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_70.ss_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl._4_4_,
                                       (int)local_70.ss_._M_t.
                                            super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            .
                                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                            ._M_head_impl) + 8))();
      }
    }
    if (local_58 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_58,local_58);
    }
    local_70.ss_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_4_ =
         SSL_do_handshake((SSL *)(this->super_QUICMethodTest).server_._M_t.
                                 super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                                 super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                                 super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
    local_80._M_head_impl._0_4_ = 1;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_60,"SSL_do_handshake(server_.get())","1",(int *)&local_70,
               (int *)&local_80);
    if (local_60[0] == (internal)0x0) {
      testing::Message::Message(&local_70);
      if (local_58 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar5 = "";
      }
      else {
        pcVar5 = (local_58->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_80,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x1f13,pcVar5);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_80,&local_70);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_80);
      if ((long *)CONCAT44(local_70.ss_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl._4_4_,
                           (int)local_70.ss_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_70.ss_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl._4_4_,
                                       (int)local_70.ss_._M_t.
                                            super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            .
                                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                            ._M_head_impl) + 8))();
      }
    }
    if (local_58 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_58,local_58);
    }
    iVar2 = (internal)
            MockQUICTransportPair::SecretsMatch
                      ((this->super_QUICMethodTest).transport_._M_t.
                       super___uniq_ptr_impl<bssl::(anonymous_namespace)::MockQUICTransportPair,_std::default_delete<bssl::(anonymous_namespace)::MockQUICTransportPair>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_bssl::(anonymous_namespace)::MockQUICTransportPair_*,_std::default_delete<bssl::(anonymous_namespace)::MockQUICTransportPair>_>
                       .
                       super__Head_base<0UL,_bssl::(anonymous_namespace)::MockQUICTransportPair_*,_false>
                       ._M_head_impl,ssl_encryption_application);
    local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (!(bool)iVar2) {
      local_70.ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_1_ = iVar2;
      testing::Message::Message((Message *)&local_80);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_60,(internal *)&local_70,
                 (AssertionResult *)"transport_->SecretsMatch(ssl_encryption_application)","false",
                 "true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_78,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x1f14,(char *)CONCAT71(local_60._1_7_,local_60[0]));
      testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_80);
      testing::internal::AssertHelper::~AssertHelper(&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_60._1_7_,local_60[0]) != &local_50) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_60._1_7_,local_60[0]),local_50._M_allocated_capacity + 1);
      }
      if (local_80._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_80._M_head_impl + 8))();
      }
      if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_68,local_68);
      }
    }
    bVar1 = (((this->super_QUICMethodTest).transport_._M_t.
              super___uniq_ptr_impl<bssl::(anonymous_namespace)::MockQUICTransportPair,_std::default_delete<bssl::(anonymous_namespace)::MockQUICTransportPair>_>
              ._M_t.
              super__Tuple_impl<0UL,_bssl::(anonymous_namespace)::MockQUICTransportPair_*,_std::default_delete<bssl::(anonymous_namespace)::MockQUICTransportPair>_>
              .super__Head_base<0UL,_bssl::(anonymous_namespace)::MockQUICTransportPair_*,_false>.
             _M_head_impl)->client_).has_alert_;
    local_70.ss_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_1_ = (internal)(bVar1 ^ 1);
    local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (bVar1 == true) {
      testing::Message::Message((Message *)&local_80);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_60,(internal *)&local_70,
                 (AssertionResult *)"transport_->client()->has_alert()","true","false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_78,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x1f15,(char *)CONCAT71(local_60._1_7_,local_60[0]));
      testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_80);
      testing::internal::AssertHelper::~AssertHelper(&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_60._1_7_,local_60[0]) != &local_50) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_60._1_7_,local_60[0]),local_50._M_allocated_capacity + 1);
      }
      if (local_80._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_80._M_head_impl + 8))();
      }
      if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_68,local_68);
      }
    }
    bVar1 = (((this->super_QUICMethodTest).transport_._M_t.
              super___uniq_ptr_impl<bssl::(anonymous_namespace)::MockQUICTransportPair,_std::default_delete<bssl::(anonymous_namespace)::MockQUICTransportPair>_>
              ._M_t.
              super__Tuple_impl<0UL,_bssl::(anonymous_namespace)::MockQUICTransportPair_*,_std::default_delete<bssl::(anonymous_namespace)::MockQUICTransportPair>_>
              .super__Head_base<0UL,_bssl::(anonymous_namespace)::MockQUICTransportPair_*,_false>.
             _M_head_impl)->server_).has_alert_;
    local_70.ss_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_1_ = (internal)(bVar1 ^ 1);
    local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (bVar1 == true) {
      testing::Message::Message((Message *)&local_80);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_60,(internal *)&local_70,
                 (AssertionResult *)"transport_->server()->has_alert()","true","false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_78,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x1f16,(char *)CONCAT71(local_60._1_7_,local_60[0]));
      testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_80);
      testing::internal::AssertHelper::~AssertHelper(&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_60._1_7_,local_60[0]) != &local_50) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_60._1_7_,local_60[0]),local_50._M_allocated_capacity + 1);
      }
      if (local_80._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_80._M_head_impl + 8))();
      }
      if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_68,local_68);
      }
    }
    local_80._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         0xf0e0e0b04000017;
    iVar3 = SSL_provide_quic_data
                      ((this->super_QUICMethodTest).client_._M_t.
                       super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                       super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,
                       ssl_encryption_application,(uint8_t *)&local_80,8);
    local_70.ss_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_4_ =
         CONCAT31(local_70.ss_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl._1_3_,iVar3 != 0);
    local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar3 != 0) {
      local_70.ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_4_ =
           SSL_process_quic_post_handshake
                     ((this->super_QUICMethodTest).client_._M_t.
                      super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                      super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                      super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
      local_78.data_._0_4_ = 0;
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)local_60,"SSL_process_quic_post_handshake(client_.get())","0",
                 (int *)&local_70,(int *)&local_78);
      if (local_60[0] == (internal)0x0) {
        testing::Message::Message(&local_70);
        if (local_58 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar5 = "";
        }
        else {
          pcVar5 = (local_58->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_78,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x1f1c,pcVar5);
        testing::internal::AssertHelper::operator=(&local_78,&local_70);
        testing::internal::AssertHelper::~AssertHelper(&local_78);
        if ((long *)CONCAT44(local_70.ss_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl._4_4_,
                             (int)local_70.ss_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(local_70.ss_._M_t.
                                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         .
                                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                         ._M_head_impl._4_4_,
                                         (int)local_70.ss_._M_t.
                                              super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              .
                                              super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                              ._M_head_impl) + 8))();
        }
      }
      if (local_58 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        return;
      }
      this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_58;
      goto LAB_001c220e;
    }
    testing::Message::Message((Message *)&local_78);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_60,(internal *)&local_70,
               (AssertionResult *)
               "SSL_provide_quic_data(client_.get(), ssl_encryption_application, kJunk, sizeof(kJunk))"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x1f1b,(char *)CONCAT71(local_60._1_7_,local_60[0]));
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_60._1_7_,local_60[0]) != &local_50) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_60._1_7_,local_60[0]),local_50._M_allocated_capacity + 1);
    }
    _Var4._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         CONCAT44(local_78.data_._4_4_,local_78.data_._0_4_);
  }
  this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_68;
  if (_Var4._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)_Var4._M_head_impl + 8))();
  }
  local_58 = local_68;
  if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    return;
  }
LAB_001c220e:
  std::
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator()(this_00,local_58);
  return;
}

Assistant:

TEST_F(QUICMethodTest, BadPostHandshake) {
  const SSL_QUIC_METHOD quic_method = DefaultQUICMethod();

  g_last_session = nullptr;

  SSL_CTX_set_session_cache_mode(client_ctx_.get(), SSL_SESS_CACHE_BOTH);
  SSL_CTX_sess_set_new_cb(client_ctx_.get(), SaveLastSession);
  ASSERT_TRUE(SSL_CTX_set_quic_method(client_ctx_.get(), &quic_method));
  ASSERT_TRUE(SSL_CTX_set_quic_method(server_ctx_.get(), &quic_method));
  ASSERT_TRUE(CreateClientAndServer());
  ASSERT_TRUE(CompleteHandshakesForQUIC());

  EXPECT_EQ(SSL_do_handshake(client_.get()), 1);
  EXPECT_EQ(SSL_do_handshake(server_.get()), 1);
  EXPECT_TRUE(transport_->SecretsMatch(ssl_encryption_application));
  EXPECT_FALSE(transport_->client()->has_alert());
  EXPECT_FALSE(transport_->server()->has_alert());

  // Junk sent as part of post-handshake data should cause an error.
  uint8_t kJunk[] = {0x17, 0x0, 0x0, 0x4, 0xB, 0xE, 0xE, 0xF};
  ASSERT_TRUE(SSL_provide_quic_data(client_.get(), ssl_encryption_application,
                                    kJunk, sizeof(kJunk)));
  EXPECT_EQ(SSL_process_quic_post_handshake(client_.get()), 0);
}